

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O2

LispPTR parse_atomstring(char *string)

{
  int iVar1;
  uint uVar2;
  ushort packlen;
  char *pcVar3;
  DLword DVar4;
  DLword DVar5;
  char *unaff_R14;
  char *unaff_R15;
  
  pcVar3 = string + 1;
  packlen = 0;
  DVar5 = 0;
  do {
    if (pcVar3[-1] == ':') {
      pcVar3[-1] = '\0';
      DVar4 = 0;
      unaff_R14 = string;
      unaff_R15 = pcVar3;
      packlen = DVar5;
    }
    else {
      DVar4 = DVar5;
      if (pcVar3[-1] == '\0') break;
    }
    DVar5 = DVar4 + 1;
    pcVar3 = pcVar3 + 1;
  } while( true );
  DVar4 = DVar5 - 1;
  if ((packlen == 0) ||
     (iVar1 = strncmp(unaff_R14,"IL",(ulong)packlen), string = unaff_R15, DVar5 = DVar4, iVar1 == 0)
     ) {
    DVar4 = DVar5;
    unaff_R15 = string;
    uVar2 = make_atom(unaff_R15,0,DVar4);
    if (uVar2 != 0xffffffff) goto LAB_00130e6c;
    puts("trying IL:");
    unaff_R14 = "INTERLISP";
    packlen = 9;
  }
  uVar2 = get_package_atom(unaff_R15,DVar4,unaff_R14,packlen,0);
  if (uVar2 == 0xffffffff) {
    return 0xffffffff;
  }
LAB_00130e6c:
  printf("INDEX : %d\n",(ulong)(uVar2 & 0xffff));
  return uVar2 & 0xffff;
}

Assistant:

LispPTR parse_atomstring(char *string)
{
  char *start, *packageptr, *nameptr;
  DLword packagelen = 0;
  DLword namelen = 0;
  DLword cnt;
  LispPTR aindex;

  for (cnt = 0, start = string; *string != '\0'; string++, cnt++) {
    if (*string == ':') {
      packagelen = cnt;
      packageptr = start;
      nameptr = string + 1;
      cnt = 0;
      *string = 0;
    }
  }
  if (packagelen == 0) { /* treat as IL: */
    nameptr = start;
    namelen = cnt;
  } else
    namelen = cnt - 1;

  if ((packagelen == 0) || (strncmp(packageptr, "IL", packagelen) == 0)) { /* default IL: */
    aindex = make_atom(nameptr, 0, namelen);
    if (aindex == 0xffffffff) {
      printf("trying IL:\n");
      aindex = get_package_atom(nameptr, namelen, "INTERLISP", 9, 0);
    }
  } else
    aindex = get_package_atom(nameptr, namelen, packageptr, packagelen, 0);

  if (aindex == 0xffffffff) return (0xffffffff);
  printf("INDEX : %d\n", aindex & 0xffff);
  return (aindex & 0xffff);
}